

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3GenerateRowIndexDelete(Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int *aRegIdx)

{
  Index *pIdx;
  int regPrior;
  Index *pIVar1;
  Index *pPrior;
  int *piVar2;
  Index **ppIVar3;
  int iPartIdxLabel;
  int *local_40;
  Vdbe *local_38;
  
  local_38 = pParse->pVdbe;
  local_40 = aRegIdx;
  if ((pTab->tabFlags & 0x20) == 0) {
    pIVar1 = (Index *)0x0;
  }
  else {
    pIVar1 = sqlite3PrimaryKeyIndex(pTab);
  }
  ppIVar3 = &pTab->pIndex;
  regPrior = -1;
  pPrior = (Index *)0x0;
  piVar2 = local_40;
  do {
    pIdx = *ppIVar3;
    if (pIdx == (Index *)0x0) {
      return;
    }
    if (local_40 == (int *)0x0) {
      if (pIdx != pIVar1) goto LAB_0015d0ed;
    }
    else if (pIdx != pIVar1 && *piVar2 != 0) {
LAB_0015d0ed:
      regPrior = sqlite3GenerateIndexKey(pParse,pIdx,iDataCur,0,1,&iPartIdxLabel,pPrior,regPrior);
      sqlite3VdbeAddOp3(local_38,0x6f,iIdxCur,regPrior,
                        (uint)(&pIdx->nKeyCol)[(pIdx->field_0x5b & 8) == 0]);
      sqlite3ResolvePartIdxLabel(pParse,iPartIdxLabel);
      pPrior = pIdx;
    }
    ppIVar3 = &pIdx->pNext;
    iIdxCur = iIdxCur + 1;
    piVar2 = piVar2 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iDataCur,      /* Cursor of table holding data. */
  int iIdxCur,       /* First index cursor */
  int *aRegIdx       /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
){
  int i;             /* Index loop counter */
  int r1 = -1;       /* Register holding an index key */
  int iPartIdxLabel; /* Jump destination for skipping partial index entries */
  Index *pIdx;       /* Current index */
  Index *pPrior = 0; /* Prior index */
  Vdbe *v;           /* The prepared statement under construction */
  Index *pPk;        /* PRIMARY KEY index, or NULL for rowid tables */

  v = pParse->pVdbe;
  pPk = HasRowid(pTab) ? 0 : sqlite3PrimaryKeyIndex(pTab);
  for(i=0, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    assert( iIdxCur+i!=iDataCur || pPk==pIdx );
    if( aRegIdx!=0 && aRegIdx[i]==0 ) continue;
    if( pIdx==pPk ) continue;
    VdbeModuleComment((v, "GenRowIdxDel for %s", pIdx->zName));
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iDataCur, 0, 1,
                                 &iPartIdxLabel, pPrior, r1);
    sqlite3VdbeAddOp3(v, OP_IdxDelete, iIdxCur+i, r1,
                      pIdx->uniqNotNull ? pIdx->nKeyCol : pIdx->nColumn);
    sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
    pPrior = pIdx;
  }
}